

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
          (MultiFab *mf,IntVect *nghost,Real time,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *smf,
          Vector<double,_std::allocator<double>_> *stime,int scomp,int dcomp,int ncomp,
          Geometry *geom,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
          *physbcf,int bcfcomp)

{
  double dVar1;
  CPC *pCVar2;
  bool bVar3;
  Long LVar4;
  MultiFab **ppMVar5;
  double *pdVar6;
  Periodicity *in_RSI;
  CPC *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Periodicity PVar7;
  int in_stack_00000008;
  IntVect dst_ngrow;
  IntVect src_ngrow;
  int i_3;
  int j_3;
  int k_3;
  int n_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Real beta;
  Real alpha;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dfab;
  Array4<double> sfab1;
  Array4<double> sfab0;
  Real t1;
  Real t0;
  Box *bx;
  MFIter mfi;
  bool sameba;
  int destcomp;
  MultiFab *dmf;
  MultiFab raii;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff5e8;
  MFIter *in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff5fc;
  char *in_stack_fffffffffffff600;
  BoxArray *in_stack_fffffffffffff608;
  BoxArray *in_stack_fffffffffffff610;
  undefined1 do_tiling_;
  CPC *pCVar8;
  undefined4 in_stack_fffffffffffff618;
  int in_stack_fffffffffffff61c;
  int in_stack_fffffffffffff620;
  int in_stack_fffffffffffff624;
  int iVar9;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff630;
  undefined4 in_stack_fffffffffffff634;
  BoxArray *in_stack_fffffffffffff638;
  undefined4 in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff644;
  double in_stack_fffffffffffff648;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff650;
  Periodicity *in_stack_fffffffffffff658;
  CpOp in_stack_fffffffffffff660;
  bool local_999;
  CPC *in_stack_fffffffffffff668;
  int in_stack_fffffffffffff72c;
  Real in_stack_fffffffffffff730;
  int in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff73c;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  *in_stack_fffffffffffff740;
  int in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  *in_stack_fffffffffffff750;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_7d0;
  int local_7cc;
  int local_7c8;
  int local_7c4;
  int local_780;
  int local_77c;
  int local_778;
  int local_774;
  long local_730;
  long local_728;
  long local_720;
  long local_718;
  int local_710;
  int local_70c;
  int local_708;
  long local_6f0;
  long local_6e8;
  long local_6e0;
  long local_6d8;
  int local_6d0;
  int local_6cc;
  int local_6c8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  int local_690;
  int local_68c;
  int local_688;
  double local_670;
  double local_668;
  int local_65c [7];
  int *local_640;
  MFIter local_638;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  byte local_59d;
  int local_59c;
  CPC *local_598;
  CPC local_590;
  IntVect local_410;
  undefined8 local_400;
  int local_3f8;
  IntVect local_3f4;
  IntVect local_3e8;
  undefined8 local_3d4;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  double local_3b0;
  Periodicity *local_3a8;
  CPC *local_3a0;
  char *local_398;
  undefined8 local_390;
  int local_388;
  int *local_380;
  int local_378;
  int iStack_374;
  int local_370;
  undefined4 local_36c;
  int *local_368;
  undefined4 local_35c;
  int *local_358;
  undefined4 local_34c;
  int *local_348;
  undefined8 local_340;
  int local_338;
  int *local_330;
  int local_328;
  int iStack_324;
  int local_320;
  undefined4 local_31c;
  int *local_318;
  undefined4 local_30c;
  int *local_308;
  undefined4 local_2fc;
  int *local_2f8;
  undefined8 local_2f0;
  int local_2e8;
  int *local_2e0;
  int local_2d8;
  int iStack_2d4;
  int local_2d0;
  undefined4 local_2cc;
  int *local_2c8;
  undefined4 local_2bc;
  int *local_2b8;
  undefined4 local_2ac;
  int *local_2a8;
  undefined8 local_2a0;
  int local_298;
  int *local_290;
  int local_288;
  int iStack_284;
  int local_280;
  undefined4 local_27c;
  int *local_278;
  undefined4 local_26c;
  int *local_268;
  undefined4 local_25c;
  int *local_258;
  undefined8 local_250;
  int local_248;
  int *local_240;
  int local_238;
  int iStack_234;
  int local_230;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  int *local_218;
  undefined4 local_20c;
  int *local_208;
  undefined8 local_200;
  int local_1f8;
  int *local_1f0;
  int local_1e8;
  int iStack_1e4;
  int local_1e0;
  undefined4 local_1dc;
  int *local_1d8;
  undefined4 local_1cc;
  int *local_1c8;
  undefined4 local_1bc;
  int *local_1b8;
  undefined8 local_1b0;
  int local_1a8;
  int *local_1a0;
  int local_198;
  int iStack_194;
  int local_190;
  undefined4 local_18c;
  int *local_188;
  undefined4 local_17c;
  int *local_178;
  undefined4 local_16c;
  int *local_168;
  undefined8 local_160;
  int local_158;
  int *local_150;
  int local_148;
  int iStack_144;
  int local_140;
  undefined4 local_13c;
  int *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  int *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  long *local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  long *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  long *local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  long *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  long *local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  long *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  long *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  long *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long *local_40;
  int local_34;
  double local_30;
  double local_28;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *local_20;
  int local_18;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *local_c;
  int local_4;
  
  local_3b0 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_3c8 = in_R9D;
  local_3c4 = in_R8D;
  local_3a8 = in_RSI;
  local_3a0 = in_RDI;
  LVar4 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x10dfb9b);
  if (LVar4 == 1) {
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
    if ((local_3a0 == (CPC *)*ppMVar5) && (local_3c4 == local_3c8)) {
      PVar7 = Geometry::periodicity
                        ((Geometry *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
      local_3e8.vect._0_8_ = PVar7.period.vect._0_8_;
      local_3d4._0_4_ = local_3e8.vect[0];
      local_3d4._4_4_ = local_3e8.vect[1];
      local_3e8.vect[2] = PVar7.period.vect[2];
      local_3cc = local_3e8.vect[2];
      local_3e8 = PVar7.period.vect;
      FabArray<amrex::FArrayBox>::FillBoundary<double>
                (in_stack_fffffffffffff650,(int)((ulong)in_stack_fffffffffffff648 >> 0x20),
                 SUB84(in_stack_fffffffffffff648,0),
                 (IntVect *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (Periodicity *)in_stack_fffffffffffff638,
                 SUB41((uint)in_stack_fffffffffffff634 >> 0x18,0));
    }
    else {
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
      IntVect::IntVect(&local_3f4,0);
      PVar7 = Geometry::periodicity
                        ((Geometry *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
      local_410.vect._0_8_ = PVar7.period.vect._0_8_;
      local_400._0_4_ = local_410.vect[0];
      local_400._4_4_ = local_410.vect[1];
      local_410.vect[2] = PVar7.period.vect[2];
      local_3f8 = local_410.vect[2];
      local_410 = PVar7.period.vect;
      FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                 in_stack_fffffffffffff628,in_stack_fffffffffffff624,in_stack_fffffffffffff620,
                 in_stack_fffffffffffff61c,(IntVect *)in_stack_fffffffffffff610,
                 (IntVect *)in_stack_fffffffffffff650,in_stack_fffffffffffff658,
                 in_stack_fffffffffffff660,in_stack_fffffffffffff668);
    }
    goto LAB_010e1765;
  }
  LVar4 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x10dfdcf);
  if (LVar4 != 2) {
    local_398 = "FillPatchSingleLevel: high-order interpolation in time not implemented yet";
    Abort_host(in_stack_fffffffffffff600);
    goto LAB_010e1765;
  }
  MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff5f0);
  FabArrayBase::boxArray((FabArrayBase *)local_3a0);
  ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
  FabArrayBase::boxArray((FabArrayBase *)*ppMVar5);
  bVar3 = BoxArray::operator==(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  if (bVar3) {
    FabArrayBase::DistributionMap((FabArrayBase *)local_3a0);
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
    FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar5);
    bVar3 = DistributionMapping::operator==
                      ((DistributionMapping *)in_stack_fffffffffffff610,
                       (DistributionMapping *)in_stack_fffffffffffff608);
    do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff610 >> 0x38);
    if (!bVar3) goto LAB_010dfe99;
    local_598 = local_3a0;
    local_59c = local_3c8;
    local_59d = 1;
  }
  else {
LAB_010dfe99:
    do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff610 >> 0x38);
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
    FabArrayBase::boxArray((FabArrayBase *)*ppMVar5);
    ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
    FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar5);
    local_5b8 = 0;
    uStack_5b0 = 0;
    local_5c8 = 0;
    uStack_5c0 = 0;
    local_5a8 = 0;
    MFInfo::MFInfo((MFInfo *)0x10dff30);
    Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
    in_stack_fffffffffffff5e8 =
         FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x10dff4d);
    MultiFab::define((MultiFab *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     in_stack_fffffffffffff638,
                     (DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                     (int)((ulong)in_stack_fffffffffffff628 >> 0x20),(int)in_stack_fffffffffffff628,
                     (MFInfo *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                     (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff650);
    MFInfo::~MFInfo((MFInfo *)0x10dff99);
    local_598 = &local_590;
    local_59c = 0;
    local_59d = 0;
  }
  pCVar8 = local_598;
  ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
  pCVar2 = local_598;
  if (((pCVar8 != (CPC *)*ppMVar5) &&
      (ppMVar5 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8),
      pCVar2 != (CPC *)*ppMVar5)) || (local_3c4 != local_3c8)) {
    in_stack_fffffffffffff668 = local_598;
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                   (FabArrayBase *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                   (bool)do_tiling_);
    while (bVar3 = MFIter::isValid(&local_638), bVar3) {
      MFIter::tilebox((MFIter *)in_stack_fffffffffffff650);
      local_640 = local_65c;
      pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5f0,
                          (size_type)in_stack_fffffffffffff5e8);
      local_668 = *pdVar6;
      pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5f0,
                          (size_type)in_stack_fffffffffffff5e8);
      local_670 = *pdVar6;
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                 in_stack_fffffffffffff5f0);
      Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff5f0,(size_type)in_stack_fffffffffffff5e8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                 in_stack_fffffffffffff5f0);
      iVar9 = (int)&local_730;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                 in_stack_fffffffffffff5f0);
      if ((local_3b0 != local_668) || (NAN(local_3b0) || NAN(local_668))) {
        if ((local_3b0 != local_670) || (NAN(local_3b0) || NAN(local_670))) {
          local_28 = local_668;
          local_30 = local_670;
          local_34 = 2;
          std::abs(iVar9);
          in_stack_fffffffffffff650 =
               (FabArray<amrex::FArrayBox> *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          in_stack_fffffffffffff658 = (Periodicity *)std::numeric_limits<double>::epsilon();
          std::abs(iVar9);
          local_999 = true;
          if ((double)in_stack_fffffffffffff658 *
              (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) * (double)local_34 <
              (double)in_stack_fffffffffffff650) {
            std::abs(iVar9);
            in_stack_fffffffffffff648 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
            dVar1 = std::numeric_limits<double>::min();
            local_999 = in_stack_fffffffffffff648 < dVar1;
          }
          in_stack_fffffffffffff644 = CONCAT13(local_999,(int3)in_stack_fffffffffffff644);
          if (local_999 == false) {
            local_330 = local_640;
            local_2f8 = local_640;
            local_2fc = 0;
            local_328 = *local_640;
            local_308 = local_640;
            local_30c = 1;
            iStack_324 = local_640[1];
            local_340 = *(undefined8 *)local_640;
            local_318 = local_640;
            local_31c = 2;
            local_338 = local_640[2];
            local_1f0 = local_640;
            local_1b8 = local_640 + 3;
            local_1bc = 0;
            local_1e8 = *local_1b8;
            local_1c8 = local_640 + 3;
            local_1cc = 1;
            iStack_1e4 = local_640[4];
            local_200 = *(undefined8 *)local_1b8;
            local_1d8 = local_640 + 3;
            local_1dc = 2;
            local_1f8 = local_640[5];
            for (local_824 = 0; local_828 = local_338, local_320 = local_338, local_1e0 = local_1f8,
                local_824 < in_stack_00000008; local_824 = local_824 + 1) {
              for (; local_82c = iStack_324, local_828 <= local_1f8; local_828 = local_828 + 1) {
                for (; local_830 = local_328, local_82c <= iStack_1e4; local_82c = local_82c + 1) {
                  for (; local_830 <= local_1e8; local_830 = local_830 + 1) {
                    local_a4 = local_830;
                    local_a8 = local_82c;
                    local_ac = local_828;
                    local_b0 = local_824 + local_3c4;
                    local_a0 = &local_6b0;
                    local_bc = local_830;
                    local_c0 = local_82c;
                    local_c4 = local_828;
                    local_c8 = local_824 + local_3c4;
                    local_b8 = &local_6f0;
                    local_d4 = local_830;
                    local_d8 = local_82c;
                    local_dc = local_828;
                    local_e0 = local_824 + local_59c;
                    local_d0 = &local_730;
                    *(double *)
                     (local_730 +
                     ((long)(local_830 - local_710) + (local_82c - local_70c) * local_728 +
                      (local_828 - local_708) * local_720 + local_e0 * local_718) * 8) =
                         ((local_670 - local_3b0) / (local_670 - local_668)) *
                         *(double *)
                          (local_6b0 +
                          ((long)(local_830 - local_690) + (local_82c - local_68c) * local_6a8 +
                           (local_828 - local_688) * local_6a0 + local_b0 * local_698) * 8) +
                         ((local_3b0 - local_668) / (local_670 - local_668)) *
                         *(double *)
                          (local_6f0 +
                          ((long)(local_830 - local_6d0) + (local_82c - local_6cc) * local_6e8 +
                           (local_828 - local_6c8) * local_6e0 + local_c8 * local_6d8) * 8);
                  }
                }
              }
            }
          }
          else {
            local_380 = local_640;
            local_348 = local_640;
            local_34c = 0;
            local_378 = *local_640;
            local_358 = local_640;
            local_35c = 1;
            iStack_374 = local_640[1];
            local_390 = *(undefined8 *)local_640;
            local_368 = local_640;
            local_36c = 2;
            local_388 = local_640[2];
            local_240 = local_640;
            local_208 = local_640 + 3;
            local_20c = 0;
            local_238 = *local_208;
            local_218 = local_640 + 3;
            local_21c = 1;
            iStack_234 = local_640[4];
            local_250 = *(undefined8 *)local_208;
            local_228 = local_640 + 3;
            local_22c = 2;
            local_248 = local_640[5];
            for (local_874 = 0; local_878 = local_388, local_370 = local_388, local_230 = local_248,
                local_874 < in_stack_00000008; local_874 = local_874 + 1) {
              for (; local_87c = iStack_374, local_878 <= local_248; local_878 = local_878 + 1) {
                for (; local_880 = local_378, local_87c <= iStack_234; local_87c = local_87c + 1) {
                  for (; local_880 <= local_238; local_880 = local_880 + 1) {
                    local_ec = local_880;
                    local_f0 = local_87c;
                    local_f4 = local_878;
                    local_f8 = local_874 + local_3c4;
                    local_e8 = &local_6b0;
                    local_104 = local_880;
                    local_108 = local_87c;
                    local_10c = local_878;
                    local_110 = local_874 + local_59c;
                    local_100 = &local_730;
                    *(undefined8 *)
                     (local_730 +
                     ((long)(local_880 - local_710) + (local_87c - local_70c) * local_728 +
                      (local_878 - local_708) * local_720 + local_110 * local_718) * 8) =
                         *(undefined8 *)
                          (local_6b0 +
                          ((long)(local_880 - local_690) + (local_87c - local_68c) * local_6a8 +
                           (local_878 - local_688) * local_6a0 + local_f8 * local_698) * 8);
                  }
                }
              }
            }
          }
        }
        else {
          local_2e0 = local_640;
          local_2a8 = local_640;
          local_2ac = 0;
          local_2d8 = *local_640;
          local_2b8 = local_640;
          local_2bc = 1;
          iStack_2d4 = local_640[1];
          local_2f0 = *(undefined8 *)local_640;
          local_2c8 = local_640;
          local_2cc = 2;
          local_2e8 = local_640[2];
          local_1a0 = local_640;
          local_168 = local_640 + 3;
          local_16c = 0;
          local_198 = *local_168;
          local_178 = local_640 + 3;
          local_17c = 1;
          iStack_194 = local_640[4];
          local_1b0 = *(undefined8 *)local_168;
          local_188 = local_640 + 3;
          local_18c = 2;
          local_1a8 = local_640[5];
          for (local_7c4 = 0; local_7c8 = local_2e8, local_2d0 = local_2e8, local_190 = local_1a8,
              local_7c4 < in_stack_00000008; local_7c4 = local_7c4 + 1) {
            for (; local_7cc = iStack_2d4, local_7c8 <= local_1a8; local_7c8 = local_7c8 + 1) {
              for (; local_7d0 = local_2d8, local_7cc <= iStack_194; local_7cc = local_7cc + 1) {
                for (; local_7d0 <= local_198; local_7d0 = local_7d0 + 1) {
                  local_74 = local_7d0;
                  local_78 = local_7cc;
                  local_7c = local_7c8;
                  local_80 = local_7c4 + local_3c4;
                  local_70 = &local_6f0;
                  local_8c = local_7d0;
                  local_90 = local_7cc;
                  local_94 = local_7c8;
                  local_98 = local_7c4 + local_59c;
                  local_88 = &local_730;
                  *(undefined8 *)
                   (local_730 +
                   ((long)(local_7d0 - local_710) + (local_7cc - local_70c) * local_728 +
                    (local_7c8 - local_708) * local_720 + local_98 * local_718) * 8) =
                       *(undefined8 *)
                        (local_6f0 +
                        ((long)(local_7d0 - local_6d0) + (local_7cc - local_6cc) * local_6e8 +
                         (local_7c8 - local_6c8) * local_6e0 + local_80 * local_6d8) * 8);
                }
              }
            }
          }
        }
      }
      else {
        local_290 = local_640;
        local_258 = local_640;
        local_25c = 0;
        local_288 = *local_640;
        local_268 = local_640;
        local_26c = 1;
        iStack_284 = local_640[1];
        local_2a0 = *(undefined8 *)local_640;
        local_278 = local_640;
        local_27c = 2;
        local_298 = local_640[2];
        local_150 = local_640;
        local_118 = local_640 + 3;
        local_11c = 0;
        local_148 = *local_118;
        local_128 = local_640 + 3;
        local_12c = 1;
        iStack_144 = local_640[4];
        local_160 = *(undefined8 *)local_118;
        local_138 = local_640 + 3;
        local_13c = 2;
        local_158 = local_640[5];
        for (local_774 = 0; local_778 = local_298, local_280 = local_298, local_140 = local_158,
            local_774 < in_stack_00000008; local_774 = local_774 + 1) {
          for (; local_77c = iStack_284, local_778 <= local_158; local_778 = local_778 + 1) {
            for (; local_780 = local_288, local_77c <= iStack_144; local_77c = local_77c + 1) {
              for (; local_780 <= local_148; local_780 = local_780 + 1) {
                local_44 = local_780;
                local_48 = local_77c;
                local_4c = local_778;
                local_50 = local_774 + local_3c4;
                local_40 = &local_6b0;
                local_5c = local_780;
                local_60 = local_77c;
                local_64 = local_778;
                local_68 = local_774 + local_59c;
                local_58 = &local_730;
                *(undefined8 *)
                 (local_730 +
                 ((long)(local_780 - local_710) + (local_77c - local_70c) * local_728 +
                  (local_778 - local_708) * local_720 + local_68 * local_718) * 8) =
                     *(undefined8 *)
                      (local_6b0 +
                      ((long)(local_780 - local_690) + (local_77c - local_68c) * local_6a8 +
                       (local_778 - local_688) * local_6a0 + local_50 * local_698) * 8);
              }
            }
          }
        }
      }
      MFIter::operator++(&local_638);
    }
    MFIter::~MFIter(in_stack_fffffffffffff5f0);
  }
  if ((local_59d & 1) == 0) {
    iVar9 = 0;
    IntVect::IntVect((IntVect *)&local_c,0);
    local_18 = local_4;
    local_20 = local_c;
    in_stack_fffffffffffff738 = (local_3a8->period).vect[2];
    in_stack_fffffffffffff730 = *(Real *)(local_3a8->period).vect;
    pCVar8 = local_598;
    in_stack_fffffffffffff750 = local_c;
    Geometry::periodicity((Geometry *)CONCAT44(iVar9,in_stack_00000008));
    FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
               in_stack_fffffffffffff628,iVar9,in_stack_00000008,local_3c8,(IntVect *)pCVar8,
               (IntVect *)in_stack_fffffffffffff650,in_stack_fffffffffffff658,
               in_stack_fffffffffffff660,in_stack_fffffffffffff668);
    in_stack_fffffffffffff740 = local_c;
    in_stack_fffffffffffff748 = local_4;
  }
  else {
    Geometry::periodicity((Geometry *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620))
    ;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_fffffffffffff650,(int)((ulong)in_stack_fffffffffffff648 >> 0x20),
               SUB84(in_stack_fffffffffffff648,0),
               (IntVect *)CONCAT44(in_stack_fffffffffffff644,in_stack_00000008),local_3a8,
               SUB41((uint)local_3c8 >> 0x18,0));
  }
  MultiFab::~MultiFab((MultiFab *)0x10e1736);
LAB_010e1765:
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            (in_stack_fffffffffffff750,
             (MultiFab *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
             (int)((ulong)in_stack_fffffffffffff740 >> 0x20),(int)in_stack_fffffffffffff740,
             (IntVect *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
             in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
FillPatchSingleLevel (MF& mf, IntVect const& nghost, Real time,
                      const Vector<MF*>& smf, const Vector<Real>& stime,
                      int scomp, int dcomp, int ncomp,
                      const Geometry& geom,
                      BC& physbcf, int bcfcomp)
{
    BL_PROFILE("FillPatchSingleLevel");

    AMREX_ASSERT(scomp+ncomp <= smf[0]->nComp());
    AMREX_ASSERT(dcomp+ncomp <= mf.nComp());
    AMREX_ASSERT(smf.size() == stime.size());
    AMREX_ASSERT(smf.size() != 0);
    AMREX_ASSERT(nghost.allLE(mf.nGrowVect()));

    if (smf.size() == 1)
    {
        if (&mf == smf[0] && scomp == dcomp) {
            mf.FillBoundary(dcomp, ncomp, nghost, geom.periodicity());
        } else {
            mf.ParallelCopy(*smf[0], scomp, dcomp, ncomp, IntVect{0}, nghost, geom.periodicity());
        }
    }
    else if (smf.size() == 2)
    {
        BL_ASSERT(smf[0]->boxArray() == smf[1]->boxArray());
        MF raii;
        MF * dmf;
        int destcomp;
        bool sameba;
        if (mf.boxArray() == smf[0]->boxArray() &&
            mf.DistributionMap() == smf[0]->DistributionMap())
        {
            dmf = &mf;
            destcomp = dcomp;
            sameba = true;
        } else {
            raii.define(smf[0]->boxArray(), smf[0]->DistributionMap(), ncomp, 0,
                        MFInfo(), smf[0]->Factory());

            dmf = &raii;
            destcomp = 0;
            sameba = false;
        }

        if ((dmf != smf[0] && dmf != smf[1]) || scomp != dcomp)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*dmf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                const Real t0 = stime[0];
                const Real t1 = stime[1];
                auto const sfab0 = smf[0]->array(mfi);
                auto const sfab1 = smf[1]->array(mfi);
                auto       dfab  = dmf->array(mfi);

                if (time == t0)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab0(i,j,k,n+scomp);
                    });
                }
                else if (time == t1)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab1(i,j,k,n+scomp);
                    });
                }
                else if (! amrex::almostEqual(t0,t1))
                {
                    Real alpha = (t1-time)/(t1-t0);
                    Real beta = (time-t0)/(t1-t0);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = alpha*sfab0(i,j,k,n+scomp)
                            +                     beta*sfab1(i,j,k,n+scomp);
                    });
                }
                else
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab0(i,j,k,n+scomp);
                    });
                }
            }
        }

        if (sameba)
        {
            // Note that when sameba is true mf's BoxArray is nonoverlapping.
            // So FillBoundary is safe.
            mf.FillBoundary(dcomp, ncomp, nghost, geom.periodicity());
        }
        else
        {
            IntVect src_ngrow = IntVect::TheZeroVector();
            IntVect dst_ngrow = nghost;

            mf.ParallelCopy(*dmf, 0, dcomp, ncomp, src_ngrow, dst_ngrow, geom.periodicity());
        }
    }
    else {
        amrex::Abort("FillPatchSingleLevel: high-order interpolation in time not implemented yet");
    }

    physbcf(mf, dcomp, ncomp, nghost, time, bcfcomp);
}